

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

bool google::protobuf::compiler::ruby::UsesTypeFromFile
               (Descriptor *message,FileDescriptor *file,string *error)

{
  long lVar1;
  once_flag *poVar2;
  bool bVar3;
  Descriptor *pDVar4;
  EnumDescriptor *pEVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  FieldDescriptor *pFVar9;
  _func_void_FieldDescriptor_ptr *p_Var10;
  bool bVar11;
  long lVar12;
  long lVar13;
  FieldDescriptor *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  _func_void_FieldDescriptor_ptr *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar11 = 0 < *(int *)(message + 0x68);
  if (0 < *(int *)(message + 0x68)) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      lVar1 = *(long *)(message + 0x28);
      pFVar9 = (FieldDescriptor *)(lVar13 + lVar1);
      poVar2 = *(once_flag **)(lVar1 + 0x30 + lVar13);
      if (poVar2 != (once_flag *)0x0) {
        local_90 = FieldDescriptor::TypeOnceInit;
        local_f0 = pFVar9;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (poVar2,&local_90,&local_f0);
      }
      if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar1 + 0x38 + lVar13) * 4
                   ) == 10) &&
         (pDVar4 = FieldDescriptor::message_type(pFVar9),
         *(FileDescriptor **)(pDVar4 + 0x10) == file)) {
LAB_0027cc53:
        std::operator+(&local_50,"proto3 message field ",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar1 + 8 + lVar13));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_d0 = &local_c0;
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_c0 = *plVar8;
          lStack_b8 = plVar6[3];
        }
        else {
          local_c0 = *plVar8;
          local_d0 = (long *)*plVar6;
        }
        local_c8 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,**(ulong **)file);
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_60 = *plVar8;
          lStack_58 = plVar6[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar8;
          local_70 = (long *)*plVar6;
        }
        local_68 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_b0 = &local_a0;
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_a0 = *plVar8;
          lStack_98 = plVar6[3];
        }
        else {
          local_a0 = *plVar8;
          local_b0 = (long *)*plVar6;
        }
        local_a8 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,**(ulong **)file);
        pFVar9 = (FieldDescriptor *)(puVar7 + 2);
        if ((FieldDescriptor *)*puVar7 == pFVar9) {
          local_e0 = *(undefined8 *)pFVar9;
          uStack_d8 = puVar7[3];
          local_f0 = (FieldDescriptor *)&local_e0;
        }
        else {
          local_e0 = *(undefined8 *)pFVar9;
          local_f0 = (FieldDescriptor *)*puVar7;
        }
        local_e8 = puVar7[1];
        *puVar7 = pFVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
        p_Var10 = (_func_void_FieldDescriptor_ptr *)(plVar6 + 2);
        if ((_func_void_FieldDescriptor_ptr *)*plVar6 == p_Var10) {
          local_80 = *(long *)p_Var10;
          lStack_78 = plVar6[3];
          local_90 = (_func_void_FieldDescriptor_ptr *)&local_80;
        }
        else {
          local_80 = *(long *)p_Var10;
          local_90 = (_func_void_FieldDescriptor_ptr *)*plVar6;
        }
        local_88 = plVar6[1];
        *plVar6 = (long)p_Var10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)error,(string *)&local_90);
        if (local_90 != (_func_void_FieldDescriptor_ptr *)&local_80) {
          operator_delete(local_90);
        }
        if (local_f0 != (FieldDescriptor *)&local_e0) {
          operator_delete(local_f0);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (bVar11) {
          return true;
        }
        break;
      }
      poVar2 = *(once_flag **)(lVar1 + 0x30 + lVar13);
      if (poVar2 != (once_flag *)0x0) {
        local_90 = FieldDescriptor::TypeOnceInit;
        local_f0 = pFVar9;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (poVar2,&local_90,&local_f0);
      }
      if ((*(int *)(lVar1 + 0x38 + lVar13) == 0xe) &&
         (pEVar5 = FieldDescriptor::enum_type(pFVar9), *(FileDescriptor **)(pEVar5 + 0x10) == file))
      goto LAB_0027cc53;
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x98;
      bVar11 = lVar12 < *(int *)(message + 0x68);
    } while (lVar12 < *(int *)(message + 0x68));
  }
  bVar11 = 0 < *(int *)(message + 0x70);
  if ((0 < *(int *)(message + 0x70)) &&
     (bVar3 = UsesTypeFromFile(*(Descriptor **)(message + 0x38),file,error), !bVar3)) {
    lVar13 = 0;
    lVar12 = 0x90;
    do {
      lVar13 = lVar13 + 1;
      bVar11 = lVar13 < *(int *)(message + 0x70);
      if (*(int *)(message + 0x70) <= lVar13) {
        return bVar11;
      }
      bVar3 = UsesTypeFromFile((Descriptor *)(lVar12 + *(long *)(message + 0x38)),file,error);
      lVar12 = lVar12 + 0x90;
    } while (!bVar3);
  }
  return bVar11;
}

Assistant:

bool UsesTypeFromFile(const Descriptor* message, const FileDescriptor* file,
                      string* error) {
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if ((field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
         field->message_type()->file() == file) ||
        (field->type() == FieldDescriptor::TYPE_ENUM &&
         field->enum_type()->file() == file)) {
      *error = "proto3 message field " + field->full_name() + " in file " +
               file->name() + " has a dependency on a type from proto2 file " +
               file->name() +
               ".  Ruby doesn't support proto2 yet, so we must fail.";
      return true;
    }
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    if (UsesTypeFromFile(message->nested_type(i), file, error)) {
      return true;
    }
  }

  return false;
}